

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O0

void __thiscall ProblemDecTiger::ProblemDecTiger(ProblemDecTiger *this)

{
  DecPOMDPDiscrete *pDVar1;
  ProblemDecTiger *pPVar2;
  ProblemDecTiger *in_RDI;
  MultiAgentDecisionProcess *unaff_retaddr;
  size_t testNRJO;
  size_t testNRJA;
  ProblemDecTiger *in_stack_00000220;
  ProblemDecTiger *in_stack_00000230;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  MultiAgentDecisionProcessDiscrete *in_stack_ffffffffffffff20;
  ProblemDecTiger *this_00;
  string *descr;
  pointer_____offset_0x60___ *this_01;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  MultiAgentDecisionProcessDiscrete *in_stack_ffffffffffffff70;
  undefined1 local_61 [56];
  allocator<char> local_29;
  string local_28 [24];
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffffff0;
  
  pDVar1 = (DecPOMDPDiscrete *)&in_RDI->field_0x240;
  pPVar2 = in_RDI;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)pDVar1);
  this_01 = &VTT;
  POSGInterface::POSGInterface((POSGInterface *)pDVar1,&PTR_PTR_00d151b0);
  DecPOMDPInterface::DecPOMDPInterface
            ((DecPOMDPInterface *)pDVar1,
             (void **)&(((MultiAgentDecisionProcessDiscrete *)this_01)->_m_S)._m_stateVec);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)&in_RDI->field_0x248,
             (void **)&(((MultiAgentDecisionProcessDiscrete *)this_01)->_m_A)._m_initialized);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)pDVar1,
             (void **)&(((MultiAgentDecisionProcessDiscrete *)this_01)->
                       super_MultiAgentDecisionProcess)._m_unixName.field_2._M_allocated_capacity);
  __s = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)__s,(allocator<char> *)pDVar1);
  descr = (string *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)__s,(allocator<char> *)pDVar1);
  this_00 = (ProblemDecTiger *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)__s,(allocator<char> *)pDVar1);
  DecPOMDPDiscrete::DecPOMDPDiscrete(pDVar1,this_01,(string *)in_RDI,descr,(string *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  *(undefined8 *)
   &(in_RDI->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0xd148e8;
  *(undefined8 *)&in_RDI->field_0x240 = 0xd14ce8;
  *(undefined8 *)&in_RDI->field_0x240 = 0xd14ce8;
  *(undefined8 *)&in_RDI->field_0x240 = 0xd14ce8;
  *(undefined8 *)&in_RDI->field_0x240 = 0xd14ce8;
  *(undefined8 *)&in_RDI->field_0x248 = 0xd14f40;
  *(undefined8 *)
   &(in_RDI->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200 = 0xd14b60;
  *(undefined8 *)&(in_RDI->super_DecPOMDPDiscrete).field_0x220 = 2;
  *(undefined8 *)&(in_RDI->super_DecPOMDPDiscrete).field_0x228 = 2;
  in_RDI->NUMBER_OF_OBSERVATIONS = 2;
  in_RDI->NUMBER_OF_ACTIONS = 3;
  MultiAgentDecisionProcess::SetNrAgents(unaff_retaddr,(size_t)pPVar2);
  MultiAgentDecisionProcessDiscrete::SetNrStates
            (in_stack_ffffffffffffff20,CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18)
            );
  MultiAgentDecisionProcessDiscrete::SetUniformISD((MultiAgentDecisionProcessDiscrete *)0x98ca69);
  (**(code **)(*(long *)&(in_RDI->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         field_0x200 + 0x68))
            (0x3ff0000000000000,
             &(in_RDI->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200);
  ConstructActions(in_stack_00000230);
  pDVar1 = (DecPOMDPDiscrete *)
           MultiAgentDecisionProcessDiscrete::ConstructJointActions
                     ((MultiAgentDecisionProcessDiscrete *)0x98caa7);
  MultiAgentDecisionProcessDiscrete::SetActionsInitialized
            (in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
  ConstructObservations(in_stack_00000220);
  pPVar2 = (ProblemDecTiger *)
           MultiAgentDecisionProcessDiscrete::ConstructJointObservations
                     ((MultiAgentDecisionProcessDiscrete *)0x98cadf);
  MultiAgentDecisionProcessDiscrete::SetObservationsInitialized
            ((MultiAgentDecisionProcessDiscrete *)pPVar2,(bool)in_stack_ffffffffffffff1f);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel(in_stack_ffffffffffffff70);
  FillTransitionModel(this_00);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel(in_stack_fffffffffffffff0);
  FillObservationModel(in_RDI);
  MultiAgentDecisionProcessDiscrete::SetInitialized
            ((MultiAgentDecisionProcessDiscrete *)this_01,SUB81((ulong)in_RDI >> 0x38,0));
  (**(code **)(*(long *)&(in_RDI->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x178))();
  FillRewardModel(pPVar2);
  DecPOMDPDiscrete::SetInitialized(pDVar1,SUB81((ulong)pPVar2 >> 0x38,0));
  return;
}

Assistant:

ProblemDecTiger::ProblemDecTiger() :
    DecPOMDPDiscrete(
        "The Dec-Tiger Problem",
        "A toy problem, 2-agent Dec-POMDP. 2 agents have to select 1 out of 2 doors, behind one is a tiger, behind the other treasure.",
        "DecTiger"),
    NUMBER_OF_STATES(2),
    NUMBER_OF_AGENTS(2),
    NUMBER_OF_OBSERVATIONS(2),
    NUMBER_OF_ACTIONS(3)
{
    SetNrAgents(NUMBER_OF_AGENTS);
    SetNrStates(NUMBER_OF_STATES);

    SetUniformISD();
    SetDiscount(1);
    
    // add actions:
    ConstructActions();
    if(DEBUG_CJA) cout << "\n>>>Creating joint actions and set...\n"<<endl;
    // add joint actions
    size_t testNRJA = ConstructJointActions();
    if(DEBUG_CA) cout << "testNRJA="<<testNRJA<<endl;    

    SetActionsInitialized(true);

    // add observations:
    ConstructObservations();
    size_t testNRJO = ConstructJointObservations();
    if(DEBUG_CO) cout << "testNRJO="<<testNRJO<<endl;

    SetObservationsInitialized(true);

    // add the transition model
    if(DEBUG_PDT) cout << "\n>>>Adding Transition model...\n"<<endl;
    CreateNewTransitionModel();
    FillTransitionModel();    

    // add observation model
    if(DEBUG_PDT) cout << "\n>>>Adding Observation model...\n"<<endl;
    CreateNewObservationModel();
    FillObservationModel();
    MultiAgentDecisionProcessDiscrete::SetInitialized(true);

    // add rewards
    CreateNewRewardModel();
    FillRewardModel();
    if(DEBUG_PDT)     cout << "Model created..."<<endl; 
    DecPOMDPDiscrete::SetInitialized(true);
}